

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_stream.cpp
# Opt level: O0

ssize_t __thiscall dap::ContentWriter::write(ContentWriter *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  unsigned_long __val;
  element_type *peVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  undefined1 local_e1;
  string local_b0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  string *msg_local;
  ContentWriter *this_local;
  
  header.field_2._8_8_ = CONCAT44(in_register_00000034,__fd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Content-Length: ",&local_79);
  __val = std::__cxx11::string::size();
  std::__cxx11::to_string(&local_b0,__val);
  std::operator+(&local_58,&local_78,&local_b0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
                 &local_58,"\r\n\r\n");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  peVar2 = std::__shared_ptr_access<dap::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<dap::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  uVar3 = std::__cxx11::string::data();
  uVar4 = std::__cxx11::string::size();
  bVar1 = (**(code **)((long)*peVar2 + 0x20))(peVar2,uVar3,uVar4);
  local_e1 = 0;
  if ((bVar1 & 1) != 0) {
    peVar2 = std::__shared_ptr_access<dap::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<dap::Writer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    uVar3 = std::__cxx11::string::data();
    uVar4 = std::__cxx11::string::size();
    local_e1 = (**(code **)((long)*peVar2 + 0x20))(peVar2,uVar3,uVar4);
  }
  uVar3 = std::__cxx11::string::~string((string *)local_38);
  return CONCAT71((int7)((ulong)uVar3 >> 8),local_e1) & 0xffffffffffffff01;
}

Assistant:

bool ContentWriter::write(const std::string& msg) const {
  auto header =
      std::string("Content-Length: ") + std::to_string(msg.size()) + "\r\n\r\n";
  return writer->write(header.data(), header.size()) &&
         writer->write(msg.data(), msg.size());
}